

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySimple.c
# Opt level: O0

void simpleMinimal(word *x,word *pAux,word *minimal,permInfo *pi,int nVars)

{
  int local_34;
  int local_30;
  int j;
  int i;
  int nVars_local;
  permInfo *pi_local;
  word *minimal_local;
  word *pAux_local;
  word *x_local;
  
  Kit_TruthCopy_64bit(pAux,x,nVars);
  Kit_TruthNot_64bit(x,nVars);
  minWord(x,pAux,minimal,nVars);
  local_30 = pi->totalSwaps;
  while (local_30 = local_30 + -1, -1 < local_30) {
    Kit_TruthSwapAdjacentVars_64bit(x,nVars,pi->swapArray[local_30]);
    Kit_TruthSwapAdjacentVars_64bit(pAux,nVars,pi->swapArray[local_30]);
    minWord3(x,pAux,minimal,nVars);
  }
  local_34 = pi->totalFlips;
  while (local_34 = local_34 + -1, -1 < local_34) {
    Kit_TruthSwapAdjacentVars_64bit(x,nVars,0);
    Kit_TruthSwapAdjacentVars_64bit(pAux,nVars,0);
    Kit_TruthChangePhase_64bit(x,nVars,pi->flipArray[local_34]);
    Kit_TruthChangePhase_64bit(pAux,nVars,pi->flipArray[local_34]);
    minWord3(x,pAux,minimal,nVars);
    local_30 = pi->totalSwaps;
    while (local_30 = local_30 + -1, -1 < local_30) {
      Kit_TruthSwapAdjacentVars_64bit(x,nVars,pi->swapArray[local_30]);
      Kit_TruthSwapAdjacentVars_64bit(pAux,nVars,pi->swapArray[local_30]);
      minWord3(x,pAux,minimal,nVars);
    }
  }
  Kit_TruthCopy_64bit(x,minimal,nVars);
  return;
}

Assistant:

void simpleMinimal(word* x, word* pAux,word* minimal, permInfo* pi, int nVars)
{
    int i,j=0;
    Kit_TruthCopy_64bit( pAux, x, nVars );
    Kit_TruthNot_64bit( x, nVars );
    
    minWord(x, pAux, minimal, nVars);
    
    for(i=pi->totalSwaps-1;i>=0;i--)
    {
        Kit_TruthSwapAdjacentVars_64bit(x, nVars, pi->swapArray[i]);
        Kit_TruthSwapAdjacentVars_64bit(pAux, nVars, pi->swapArray[i]);
        minWord3(x, pAux, minimal, nVars);
    }
    for(j=pi->totalFlips-1;j>=0;j--)
    {
        Kit_TruthSwapAdjacentVars_64bit(x, nVars, 0);
        Kit_TruthSwapAdjacentVars_64bit(pAux, nVars, 0);
        Kit_TruthChangePhase_64bit(x, nVars, pi->flipArray[j]);
        Kit_TruthChangePhase_64bit(pAux, nVars, pi->flipArray[j]);
        minWord3(x, pAux, minimal, nVars);
        for(i=pi->totalSwaps-1;i>=0;i--)
        {
            Kit_TruthSwapAdjacentVars_64bit(x, nVars, pi->swapArray[i]);
            Kit_TruthSwapAdjacentVars_64bit(pAux, nVars, pi->swapArray[i]);
            minWord3(x, pAux, minimal, nVars);
        }
    } 
    Kit_TruthCopy_64bit( x, minimal, nVars );    
}